

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application_glfw.cpp
# Opt level: O0

void __thiscall Application::createWindow(Application *this,string *windowName,int width,int height)

{
  int width_00;
  int iVar1;
  char *title;
  GLFWwindow *pGVar2;
  int local_24;
  int local_20;
  int frameBufferWidth;
  int height_local;
  int width_local;
  string *windowName_local;
  Application *this_local;
  
  local_20 = height;
  frameBufferWidth = width;
  _height_local = windowName;
  windowName_local = (string *)this;
  std::__cxx11::string::operator=((string *)&this->_windowName,(string *)windowName);
  this->_windowWidth = frameBufferWidth;
  this->_windowHeight = local_20;
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fprintf(_stderr,"Failed to initialize GLFW\n");
    exit(1);
  }
  glfwWindowHint(0x21005,0x10);
  glfwWindowHint(0x2000a,1);
  width_00 = frameBufferWidth;
  iVar1 = local_20;
  title = (char *)std::__cxx11::string::c_str();
  pGVar2 = glfwCreateWindow(width_00,iVar1,title,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  this->_window = pGVar2;
  if (this->_window == (GLFWwindow *)0x0) {
    fprintf(_stderr,"Failed to open GLFW window\n");
    glfwTerminate();
    exit(1);
  }
  glfwSetWindowUserPointer(this->_window,this);
  glfwSetFramebufferSizeCallback(this->_window,_sizeCallback);
  glfwMakeContextCurrent(this->_window);
  gladLoadGL(glfwGetProcAddress);
  glfwSwapInterval((uint)((this->vsyncEnabled & 1U) != 0));
  _reshapeFrustum(this,frameBufferWidth,local_20);
  glfwGetFramebufferSize(this->_window,&local_24,(int *)0x0);
  this->screenScale = (float)local_24 / (float)frameBufferWidth;
  printf("screen scale detected: %f",(double)this->screenScale);
  puts("");
  fflush(_stdout);
  return;
}

Assistant:

void Application::createWindow(std::string windowName, int width, int height) {
    _windowName = windowName;
    _windowWidth = width;
    _windowHeight = height;

    if (!glfwInit()) {
        fprintf( stderr, "Failed to initialize GLFW\n" );
        exit( EXIT_FAILURE );
    }

    glfwWindowHint(GLFW_DEPTH_BITS, 16);
    glfwWindowHint(GLFW_TRANSPARENT_FRAMEBUFFER, GLFW_TRUE);

    _window = glfwCreateWindow(width, height, _windowName.c_str(), NULL, NULL);
    if (!_window) {
        fprintf(stderr, "Failed to open GLFW window\n");
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // Set callback functions
    glfwSetWindowUserPointer(_window, this);
    glfwSetFramebufferSizeCallback(_window, _sizeCallback);

    // Lock to (probably) 60fps if vsyncEnabled, or unlock framerate
    glfwMakeContextCurrent(_window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(vsyncEnabled ? 1 : 0);

    // Setup the frame buffer and view port size
    _reshapeFrustum(width, height);
    //_reshapeOrtho(width, height); // Don't seem to need to set ortho size here...

    // Detect screen scale by comparing window size to framebuffer size
    int frameBufferWidth;
    glfwGetFramebufferSize(_window, &frameBufferWidth, NULL);
    screenScale = (float)frameBufferWidth / (float)width;
    DEBUG_PRINTLN("screen scale detected: %f", screenScale);
}